

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ObjIsMuxType(Gia_Obj_t *pNode)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (((ulong)pNode & 1) == 0) {
    uVar1 = *(ulong *)pNode;
    uVar8 = uVar1 & 0x1fffffff;
    uVar7 = 0;
    uVar4 = 0;
    if (uVar8 != 0x1fffffff && -1 < (int)uVar1) {
      iVar3 = Gia_ObjIsBuf(pNode);
      if (((~uVar1 & 0x2000000020000000) == 0) && (uVar4 = uVar7, iVar3 == 0)) {
        uVar2 = *(ulong *)(pNode + -uVar8);
        if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar2) {
          pGVar5 = pNode + -(uVar1 >> 0x20 & 0x1fffffff);
          uVar1 = *(ulong *)pGVar5;
          if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar1) {
            uVar4 = 1;
            if ((((pNode + (-uVar8 - (uVar2 & 0x1fffffff)) != pGVar5 + -(uVar1 & 0x1fffffff)) ||
                 ((((uint)uVar1 ^ (uint)uVar2) >> 0x1d & 1) == 0)) &&
                ((uVar7 = (uint)(uVar1 >> 0x20),
                 pNode + (-uVar8 - (uVar2 & 0x1fffffff)) != pGVar5 + -(ulong)(uVar7 & 0x1fffffff) ||
                 (((uVar7 >> 0x1d ^ (uint)(uVar2 >> 0x1d) & 7) & 1) == 0)))) &&
               (((uVar6 = (uint)(uVar2 >> 0x20),
                 pNode + (-uVar8 - (ulong)(uVar6 & 0x1fffffff)) != pGVar5 + -(uVar1 & 0x1fffffff) ||
                 ((((uint)(uVar1 >> 0x1d) & 7 ^ uVar6 >> 0x1d) & 1) == 0)) &&
                (uVar4 = 0,
                pNode + (-uVar8 - (ulong)(uVar6 & 0x1fffffff)) ==
                pGVar5 + -(ulong)(uVar7 & 0x1fffffff))))) {
              uVar4 = (uVar7 ^ uVar6) >> 0x1d & 1;
            }
          }
        }
      }
    }
    return uVar4;
  }
  __assert_fail("!Gia_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x38a,"int Gia_ObjIsMuxType(Gia_Obj_t *)");
}

Assistant:

int Gia_ObjIsMuxType( Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Gia_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Gia_ObjIsAnd(pNode) || Gia_ObjIsBuf(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Gia_ObjFaninC0(pNode) || !Gia_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Gia_ObjFanin0(pNode);
    pNode1 = Gia_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Gia_ObjIsAnd(pNode0) || !Gia_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1))) || 
           (Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1))) ||
           (Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1))) ||
           (Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1)));
}